

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O2

void __thiscall
helics::apps::WebServer::startServer
          (WebServer *this,json *val,shared_ptr<helics::apps::TypedBrokerServer> *ptr)

{
  string_view message;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  json *pjVar4;
  invalid_argument *this_00;
  undefined7 uStack_68;
  bool exp;
  thread local_60;
  long *local_58;
  shared_ptr<helics::apps::WebServer> webptr;
  __shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  message._M_len._7_1_ = exp;
  message._M_len._0_7_ = uStack_68;
  message._M_str = (char *)local_60._M_id._M_thread;
  TypedBrokerServer::logMessage(message);
  pjVar4 = &null_abi_cxx11_;
  if (val != (json *)0x0) {
    pjVar4 = val;
  }
  this->config = pjVar4;
  exp = false;
  bVar3 = CLI::std::atomic<bool>::compare_exchange_strong(&this->running,&exp,true,seq_cst);
  if (bVar3) {
    CLI::std::make_shared<helics::apps::IocWrapper>();
    CLI::std::__shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->context).
                super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>,&local_40);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    CLI::std::mutex::lock(&this->threadGuard);
    std::dynamic_pointer_cast<helics::apps::WebServer,helics::apps::TypedBrokerServer>
              ((shared_ptr<helics::apps::TypedBrokerServer> *)&webptr);
    _Var2 = webptr.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    peVar1 = webptr.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (webptr.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,"pointer to a webserver required for operation");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    local_40._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         webptr.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_30._M_pi =
         webptr.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    webptr.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    webptr.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_60._M_id._M_thread = (id)0;
    local_40._M_ptr = (element_type *)this;
    local_58 = (long *)operator_new(0x20);
    *local_58 = (long)&PTR___State_impl_004cdc60;
    local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58[1] = (long)this;
    local_40._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58[2] = (long)peVar1;
    local_58[3] = (long)_Var2._M_pi;
    std::thread::_M_start_thread(&local_60,&local_58,0);
    if (local_58 != (long *)0x0) {
      (**(code **)(*local_58 + 8))();
    }
    CLI::std::thread::operator=(&this->mainLoopThread,&local_60);
    CLI::std::thread::~thread(&local_60);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    std::thread::detach();
    sched_yield();
    while (((this->executing)._M_base._M_i & 1U) == 0) {
      local_40._M_ptr = (element_type *)0x32;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&local_40);
    }
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&webptr.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pthread_mutex_unlock((pthread_mutex_t *)&this->threadGuard);
  }
  return;
}

Assistant:

void WebServer::startServer(const nlohmann::json* val,
                            const std::shared_ptr<TypedBrokerServer>& ptr)
{
    logMessage("starting broker web server");
    config = (val != nullptr) ? val : &null;
    bool exp{false};
    if (running.compare_exchange_strong(exp, true)) {
        // The io_context is required for all I/O
        context = std::make_shared<IocWrapper>();

        const std::lock_guard<std::mutex> tlock(threadGuard);

        auto webptr = std::dynamic_pointer_cast<WebServer>(ptr);
        if (!webptr) {
            throw(std::invalid_argument("pointer to a webserver required for operation"));
        }
        mainLoopThread = std::thread([this, webptr = std::move(webptr)]() { mainLoop(webptr); });
        mainLoopThread.detach();
        std::this_thread::yield();
        while (!executing) {
            std::this_thread::sleep_for(std::chrono::milliseconds(50));
        }
    }
}